

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

int64_t __thiscall leveldb::DBImpl::TEST_MaxNextLevelOverlappingBytes(DBImpl *this)

{
  int iVar1;
  int64_t iVar2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar1 == 0) {
    iVar2 = VersionSet::MaxNextLevelOverlappingBytes(this->versions_);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    return iVar2;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

int64_t DBImpl::TEST_MaxNextLevelOverlappingBytes() {
  MutexLock l(&mutex_);
  return versions_->MaxNextLevelOverlappingBytes();
}